

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

Interpolation __thiscall tinyusdz::GPrim::get_displayColorsInterpolation(GPrim *this)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *this_00;
  Attribute *pAVar3;
  AttrMeta *pAVar4;
  value_type *pvVar5;
  string local_90;
  allocator local_69;
  key_type local_68;
  mapped_type *local_48;
  mapped_type *prop;
  key_type local_38;
  GPrim *local_18;
  GPrim *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,"primvars:displayColor",(allocator *)((long)&prop + 7));
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::count(&this->props,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&prop + 7));
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"primvars:displayColor",&local_69);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::at(&this->props,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = this_00;
    pAVar3 = Property::get_attribute(this_00);
    Attribute::type_name_abi_cxx11_(&local_90,pAVar3);
    bVar1 = std::operator==(&local_90,"color3f[]");
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar1) {
      pAVar3 = Property::get_attribute(local_48);
      pAVar4 = Attribute::metas(pAVar3);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)pAVar4);
      if (bVar1) {
        pAVar3 = Property::get_attribute(local_48);
        pAVar4 = Attribute::metas(pAVar3);
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                           (&pAVar4->interpolation);
        return *pvVar5;
      }
    }
  }
  return Vertex;
}

Assistant:

Interpolation GPrim::get_displayColorsInterpolation() const {
  if (props.count("primvars:displayColor")) {
    const auto &prop = props.at("primvars:displayColor");
    if (prop.get_attribute().type_name() == "color3f[]") {
      if (prop.get_attribute().metas().interpolation) {
        return prop.get_attribute().metas().interpolation.value();
      }
    }
  }

  return Interpolation::Vertex;  // default 'vertex'
}